

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

void quat_get_axis_angle(quat q,vec3 *axis,float *angle)

{
  float fVar1;
  float *angle_local;
  vec3 *axis_local;
  quat q_local;
  
  q_local.y = q.w;
  fVar1 = acosf(q_local.y);
  *angle = fVar1 * 2.0;
  axis_local._0_4_ = q.x;
  fVar1 = sqrtf(-q_local.y * q_local.y + 1.0);
  axis->x = axis_local._0_4_ / fVar1;
  axis_local._4_4_ = q.y;
  fVar1 = sqrtf(-q_local.y * q_local.y + 1.0);
  axis->y = axis_local._4_4_ / fVar1;
  q_local.x = q.z;
  fVar1 = sqrtf(-q_local.y * q_local.y + 1.0);
  axis->z = q_local.x / fVar1;
  return;
}

Assistant:

void quat_get_axis_angle(quat q, vec3 *axis, float *angle) {
    *angle = 2.0f * acosf(q.w);
    axis->x = q.x / sqrtf(1.0f - q.w*q.w);
    axis->y = q.y / sqrtf(1.0f - q.w*q.w);
    axis->z = q.z / sqrtf(1.0f - q.w*q.w);
}